

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

deUint32 deqp::gles31::Functional::getGLTextureTarget(TextureType texType)

{
  deUint32 local_c;
  TextureType texType_local;
  
  switch(texType) {
  case TEXTURETYPE_2D:
    local_c = 0xde1;
    break;
  case TEXTURETYPE_CUBE:
    local_c = 0x8513;
    break;
  case TEXTURETYPE_2D_ARRAY:
    local_c = 0x8c1a;
    break;
  case TEXTURETYPE_3D:
    local_c = 0x806f;
    break;
  default:
    local_c = 0xffffffff;
    break;
  case TEXTURETYPE_BUFFER:
    local_c = 0x8c2a;
  }
  return local_c;
}

Assistant:

static inline deUint32 getGLTextureTarget (TextureType texType)
{
	switch (texType)
	{
		case TEXTURETYPE_BUFFER:	return GL_TEXTURE_BUFFER;
		case TEXTURETYPE_2D:		return GL_TEXTURE_2D;
		case TEXTURETYPE_3D:		return GL_TEXTURE_3D;
		case TEXTURETYPE_CUBE:		return GL_TEXTURE_CUBE_MAP;
		case TEXTURETYPE_2D_ARRAY:	return GL_TEXTURE_2D_ARRAY;
		default:
			DE_ASSERT(false);
			return (deUint32)-1;
	}
}